

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

int cal_mb_wiener_var_hook(void *arg1,void *unused)

{
  int *piVar1;
  byte bVar2;
  AV1_COMP *cpi;
  MACROBLOCK *x;
  AV1_PRIMARY *pAVar3;
  pthread_mutex_t *__mutex;
  int iVar4;
  int iVar5;
  int iVar6;
  double sum_est_rate;
  double sum_rec_distortion;
  int16_t src_diff [1024];
  tran_low_t dqcoeff [1024];
  tran_low_t qcoeff [1024];
  tran_low_t coeff [1024];
  double local_3870;
  double local_3868;
  int16_t local_3860 [1024];
  tran_low_t local_3060 [1024];
  tran_low_t local_2060 [1024];
  tran_low_t local_1060 [1036];
  
  cpi = *arg1;
  x = *(MACROBLOCK **)((long)arg1 + 8);
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [cpi->weber_bsize];
  pAVar3 = cpi->ppi;
  __mutex = (cpi->mt_info).enc_row_mt.mutex_;
  (x->e_mbd).error_info = (aom_internal_error_info *)((long)arg1 + 0x18);
  iVar4 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar4 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    local_3868 = 0.0;
    local_3870 = 0.0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((cpi->mt_info).enc_row_mt.mb_wiener_mt_exit == false) {
      do {
        iVar4 = (cpi->common).mi_params.mi_rows;
        iVar5 = (pAVar3->intra_row_mt_sync).next_mi_row;
        iVar6 = -1;
        if (iVar5 < iVar4) {
          piVar1 = &(pAVar3->intra_row_mt_sync).num_threads_working;
          *piVar1 = *piVar1 + 1;
          (pAVar3->intra_row_mt_sync).next_mi_row = (uint)bVar2 + iVar5;
          iVar6 = iVar5;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (iVar4 <= iVar5) goto LAB_001c5691;
        av1_calc_mb_wiener_var_row
                  (cpi,x,&x->e_mbd,iVar6,local_3860,local_1060,local_2060,local_3060,&local_3868,
                   &local_3870,*(uint8_t **)(*(long *)((long)arg1 + 8) + 0x25d48));
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        piVar1 = &(pAVar3->intra_row_mt_sync).num_threads_working;
        *piVar1 = *piVar1 + -1;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
      } while ((cpi->mt_info).enc_row_mt.mb_wiener_mt_exit == false);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
LAB_001c5691:
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar4 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    (cpi->mt_info).enc_row_mt.mb_wiener_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar4 = (cpi->common).mi_params.mi_cols;
    iVar5 = iVar4 + 8;
    iVar4 = iVar4 + 0x17;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    if (0 < (cpi->common).mi_params.mi_rows) {
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [cpi->weber_bsize];
      pAVar3 = cpi->ppi;
      iVar6 = 0;
      iVar5 = iVar6;
      do {
        iVar6 = iVar6 + (uint)bVar2;
        (*(cpi->mt_info).intra_mt.intra_sync_write_ptr)
                  (&pAVar3->intra_row_mt_sync,iVar5,(iVar4 >> 4) + -1,iVar4 >> 4);
        iVar5 = iVar5 + 1;
      } while (iVar6 < (cpi->common).mi_params.mi_rows);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int cal_mb_wiener_var_hook(void *arg1, void *unused) {
  (void)unused;
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  MACROBLOCK *x = &thread_data->td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const int mb_step = mi_size_wide[bsize];
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  (void)enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex = enc_row_mt->mutex_;
#endif

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex);
    enc_row_mt->mb_wiener_mt_exit = true;
    pthread_mutex_unlock(enc_row_mt_mutex);
#endif
    set_mb_wiener_var_calc_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;
  DECLARE_ALIGNED(32, int16_t, src_diff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, coeff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, qcoeff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, dqcoeff[32 * 32]);
  double sum_rec_distortion = 0;
  double sum_est_rate = 0;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex);
#endif
    int has_jobs = enc_row_mt->mb_wiener_mt_exit
                       ? 0
                       : get_next_job_allintra(intra_row_mt_sync,
                                               cpi->common.mi_params.mi_rows,
                                               &current_mi_row, mb_step);
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex);
#endif
    if (!has_jobs) break;
    // TODO(chengchen): properly accumulate the distortion and rate.
    av1_calc_mb_wiener_var_row(cpi, x, xd, current_mi_row, src_diff, coeff,
                               qcoeff, dqcoeff, &sum_rec_distortion,
                               &sum_est_rate,
                               thread_data->td->wiener_tmp_pred_buf);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex);
#endif
    intra_row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex);
#endif
  }
  error_info->setjmp = 0;
  return 1;
}